

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O0

void __thiscall wasm::CodeFolding::visitBreak(CodeFolding *this,Break *curr)

{
  Break *pBVar1;
  Expression **ppEVar2;
  mapped_type *this_00;
  Tail local_48;
  Block *local_30;
  Block *parent;
  Break *local_18;
  Break *curr_local;
  CodeFolding *this_local;
  
  local_18 = curr;
  curr_local = (Break *)this;
  if (curr->condition == (Expression *)0x0) {
    ppEVar2 = SmallVector<wasm::Expression_*,_10UL>::back
                        (&(this->
                          super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>_>
                          ).
                          super_ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
                          .controlFlowStack);
    local_30 = Expression::dynCast<wasm::Block>(*ppEVar2);
    pBVar1 = local_18;
    if ((local_30 == (Block *)0x0) ||
       (ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                            (&(local_30->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ), pBVar1 != (Break *)*ppEVar2)) {
      std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::insert
                (&this->unoptimizables,&local_18->name);
    }
    else {
      this_00 = std::
                map<wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>_>_>
                ::operator[](&this->breakTails,&local_18->name);
      Tail::Tail(&local_48,(Expression *)local_18,local_30);
      std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::push_back
                (this_00,&local_48);
    }
  }
  else {
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::insert
              (&this->unoptimizables,&curr->name);
  }
  return;
}

Assistant:

void visitBreak(Break* curr) {
    if (curr->condition) {
      unoptimizables.insert(curr->name);
    } else {
      // we can only optimize if we are at the end of the parent block.
      // TODO: Relax this.
      Block* parent = controlFlowStack.back()->dynCast<Block>();
      if (parent && curr == parent->list.back()) {
        breakTails[curr->name].push_back(Tail(curr, parent));
      } else {
        unoptimizables.insert(curr->name);
      }
    }
  }